

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void __thiscall
DumpMetaArrayVal<double>::operator()(DumpMetaArrayVal<double> *this,PtexMetaData *meta,char *key)

{
  ulong uVar1;
  int count;
  double *val;
  
  val = (double *)0x0;
  (*meta->_vptr_PtexMetaData[0x10])(meta,key,&val);
  uVar1 = 0;
  while( true ) {
    if (-1 < (long)uVar1) break;
    if (((int)((uVar1 & 0xffffffff) / 10) * -10 + (int)uVar1 == 0) && (uVar1 != 0)) {
      std::operator<<((ostream *)&std::cout,"\n  ");
    }
    std::operator<<((ostream *)&std::cout,"  ");
    std::ostream::_M_insert<double>(val[uVar1]);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }